

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmq.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  mqd_t __mqdes;
  int iVar2;
  char *__msg_ptr;
  ssize_t sVar3;
  uint prio;
  string QName;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&QName,"/liblogger",(allocator<char> *)&prio);
  while( true ) {
    uVar1 = getopt(argc,argv,"hq?");
    if (uVar1 != 0x71) break;
    std::__cxx11::string::assign((char *)&QName);
  }
  if (uVar1 == 0xffffffff) {
    mq_unlink(QName._M_dataplus._M_p);
    __mqdes = mq_open(QName._M_dataplus._M_p,0xc0,0x1a4,0);
    if (-1 < __mqdes) {
      __msg_ptr = (char *)malloc(0xffff);
      while( true ) {
        prio = 0;
        sVar3 = mq_receive(__mqdes,__msg_ptr,0xfffd,&prio);
        if (sVar3 < 4) break;
        __msg_ptr[sVar3] = '\0';
        uVar1 = atoi(__msg_ptr);
        printf("GOT MSG %d %s\n",(ulong)uVar1,__msg_ptr + 1);
      }
      perror("mq_receive");
      iVar2 = mq_close(__mqdes);
      if (-1 < iVar2) {
        free(__msg_ptr);
        std::__cxx11::string::~string((string *)&QName);
        return 0;
      }
      perror("mq_close");
      abort();
    }
    perror("mq_open");
  }
  else {
    if (uVar1 == 0x68) {
      print_help(_stdout,*argv);
      exit(0);
    }
    printf("Unknown option \'%c\'\n",(ulong)uVar1);
    print_help(_stderr,*argv);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    std::string QName = "/liblogger";
    const char *ops = "hq?";
    int opt = 0;

    while( (opt = getopt(argc, argv, ops)) != -1) {
        switch(opt) {
            case 'h':
                print_help(stdout, argv[0]);
                exit(EXIT_SUCCESS);
                break;
            case 'q':
                QName = optarg;
                break;
            default:
                printf("Unknown option '%c'\n", opt);
                print_help(stderr, argv[0]);
                exit(EXIT_FAILURE);
                break;
        }
    }
    
    mq_unlink(QName.c_str());

    mqd_t qid = mq_open(QName.c_str(), O_RDONLY | O_CREAT | O_EXCL, 0644, NULL);
    if (qid < 0) {
        perror("mq_open");
        exit(EXIT_FAILURE);
    }

    size_t buflen = 65535;
    char *buf = (char *) malloc(buflen);

    bool running = true;
    do {
        unsigned int prio = 0;
        ssize_t ret = mq_receive(qid, buf, buflen - 2, &prio);
        if (ret > 3) {
            buf[ret] = 0;
            const int type = atoi(buf);
            const char *msg = &buf[1];
            printf("GOT MSG %d %s\n", type, msg);

        } else {
            perror("mq_receive");
            running = false;
        }

    } while(running);

    if (mq_close(qid) < 0) {
        perror("mq_close");
        abort();
    }

    free(buf);

    return EXIT_SUCCESS;
}